

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

string * bech32::Encode(string *__return_storage_ptr__,Encoding encoding,string *hrp,data *values)

{
  size_type sVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  uint32_t uVar5;
  undefined4 *puVar6;
  size_type sVar7;
  long lVar8;
  uint8_t *i;
  byte *pbVar9;
  value_type *__val;
  uint uVar10;
  data *__range1;
  long in_FS_OFFSET;
  undefined1 auVar11 [16];
  vector<unsigned_char,_std::allocator<unsigned_char>_> enc;
  value_type_conflict3 local_51;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  long local_38;
  long lVar12;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = hrp->_M_string_length;
  if (sVar1 != 0) {
    sVar7 = 0;
    do {
      if (0xe5 < (byte)((hrp->_M_dataplus)._M_p[sVar7] + 0xa5U)) {
        __assert_fail("c < \'A\' || c > \'Z\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bech32.cpp"
                      ,0x16a,
                      "std::string bech32::Encode(Encoding, const std::string &, const data &)");
      }
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,
             (size_type)
             ((values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish +
             (sVar1 - (long)(values->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start) + 7));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
            (__return_storage_ptr__,(hrp->_M_dataplus)._M_p,hrp->_M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (__return_storage_ptr__,'1');
  pbVar2 = (values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pbVar9 = (values->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; pbVar9 != pbVar2; pbVar9 = pbVar9 + 1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,"qpzry9x8gf2tvdw0s3jn54khce6mua7l"[*pbVar9]);
  }
  anon_unknown_0::PreparePolynomialCoefficients(&local_50,hrp,values);
  local_51 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (&local_50,
             (iterator)
             local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,6,&local_51);
  if (1 < encoding - BECH32) {
    __assert_fail("encoding == Encoding::BECH32 || encoding == Encoding::BECH32M",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bech32.cpp"
                  ,0x7b,"uint32_t bech32::(anonymous namespace)::EncodingConstant(Encoding)");
  }
  uVar5 = anon_unknown_0::PolyMod
                    ((anon_unknown_0 *)
                     local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (data *)local_50.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
  uVar10 = 0x2bc830a3;
  if (encoding == BECH32) {
    uVar10 = 1;
  }
  puVar6 = (undefined4 *)operator_new(6);
  *(undefined2 *)(puVar6 + 1) = 0;
  *puVar6 = 0;
  auVar3 = _DAT_00e4a2c0;
  lVar8 = 1;
  bVar4 = 0x14;
  auVar11 = _DAT_00e4a2b0;
  do {
    if (SUB164(auVar11 ^ auVar3,4) == -0x80000000 && SUB164(auVar11 ^ auVar3,0) < -0x7ffffffa) {
      *(byte *)((long)puVar6 + lVar8 + -1) = (byte)((uVar5 ^ uVar10) >> (bVar4 + 5 & 0x1f)) & 0x1f;
      *(byte *)((long)puVar6 + lVar8) = (byte)((uVar5 ^ uVar10) >> (bVar4 & 0x1f)) & 0x1f;
    }
    lVar12 = auVar11._8_8_;
    auVar11._0_8_ = auVar11._0_8_ + 2;
    auVar11._8_8_ = lVar12 + 2;
    lVar8 = lVar8 + 2;
    bVar4 = bVar4 - 10;
  } while (lVar8 != 7);
  if ((anon_unknown_0 *)
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (anon_unknown_0 *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar8 = 0;
  do {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,
               "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[*(byte *)((long)puVar6 + lVar8)]);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  operator_delete(puVar6,6);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Encode(Encoding encoding, const std::string& hrp, const data& values) {
    // First ensure that the HRP is all lowercase. BIP-173 and BIP350 require an encoder
    // to return a lowercase Bech32/Bech32m string, but if given an uppercase HRP, the
    // result will always be invalid.
    for (const char& c : hrp) assert(c < 'A' || c > 'Z');

    std::string ret;
    ret.reserve(hrp.size() + 1 + values.size() + CHECKSUM_SIZE);
    ret += hrp;
    ret += '1';
    for (const uint8_t& i : values) ret += CHARSET[i];
    for (const uint8_t& i : CreateChecksum(encoding, hrp, values)) ret += CHARSET[i];
    return ret;
}